

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcFurnitureStandard::~IfcFurnitureStandard(IfcFurnitureStandard *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this[-1].super_IfcControl.super_IfcObject.field_0x28 = 0x876bd8;
  *(undefined8 *)&(this->super_IfcControl).super_IfcObject.field_0x10 = 0x876c50;
  *(undefined8 *)
   &this[-1].super_IfcControl.super_IfcObject.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x18 = 0x876c00;
  *(undefined8 *)&this[-1].super_IfcControl.super_IfcObject.field_0xc0 = 0x876c28;
  puVar1 = *(undefined1 **)&this[-1].super_IfcControl.super_IfcObject.field_0xd0;
  if (puVar1 != &this[-1].super_IfcControl.super_IfcObject.field_0xe0) {
    operator_delete(puVar1);
  }
  *(undefined8 *)&this[-1].super_IfcControl.super_IfcObject.field_0x28 = 0x876cf0;
  *(undefined8 *)&(this->super_IfcControl).super_IfcObject.field_0x10 = 0x876d18;
  puVar1 = *(undefined1 **)&this[-1].super_IfcControl.super_IfcObject.field_0x88;
  if ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL> *)puVar1 !=
      &this[-1].super_IfcControl.super_IfcObject.
       super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>) {
    operator_delete(puVar1);
  }
  puVar1 = *(undefined1 **)&this[-1].super_IfcControl.super_IfcObject.field_0x60;
  if (puVar1 != &this[-1].super_IfcControl.super_IfcObject.field_0x70) {
    operator_delete(puVar1);
  }
  puVar1 = *(undefined1 **)&this[-1].super_IfcControl.super_IfcObject.field_0x38;
  if (puVar1 != &this[-1].super_IfcControl.super_IfcObject.field_0x48) {
    operator_delete(puVar1);
  }
  operator_delete(&this[-1].super_IfcControl.super_IfcObject.field_0x28);
  return;
}

Assistant:

IfcFurnitureStandard() : Object("IfcFurnitureStandard") {}